

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::MILSpec::Block::ByteSizeLong(Block *this)

{
  Rep *pRVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  Type *pTVar7;
  size_t sVar8;
  uint index;
  int n;
  void **ppvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_68;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_48;
  
  lVar12 = (long)(this->inputs_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->inputs_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar12 == 0) {
    lVar12 = 0;
  }
  else {
    lVar11 = lVar12 * 8;
    lVar10 = 0;
    do {
      sVar6 = NamedValueType::ByteSizeLong(*(NamedValueType **)((long)ppvVar9 + lVar10));
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar11 - lVar10 != 0);
  }
  uVar4 = (this->outputs_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + (ulong)uVar4;
  if (0 < (int)uVar4) {
    index = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->outputs_).super_RepeatedPtrFieldBase,index);
      uVar5 = (uint)pTVar7->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + pTVar7->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar4 != index);
  }
  lVar11 = (long)(this->operations_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + lVar11;
  pRVar1 = (this->operations_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (lVar11 != 0) {
    lVar10 = 0;
    do {
      sVar6 = Operation::ByteSizeLong(*(Operation **)((long)ppvVar9 + lVar10));
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar10 = lVar10 + 8;
    } while (lVar11 * 8 != lVar10);
  }
  local_48.m_ = (InnerMap *)&this->attributes_;
  sVar6 = (ulong)(uint)(this->attributes_).map_.elements_.num_elements_ + lVar12;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::InnerMap::
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  ::SearchFrom(&local_48,(this->attributes_).map_.elements_.index_of_first_non_null_);
  local_68.m_ = local_48.m_;
  local_68.node_ = local_48.node_;
  while (local_68.node_ != (Node *)0x0) {
    sVar8 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68.node_,(Value *)&(local_68.node_)->field_0x20);
    sVar6 = sVar6 + sVar8;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::InnerMap::
    iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
    ::operator++(&local_68);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar6 = sVar6 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar6;
  return sVar6;
}

Assistant:

size_t Block::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Block)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.NamedValueType inputs = 1;
  total_size += 1UL * this->_internal_inputs_size();
  for (const auto& msg : this->inputs_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string outputs = 2;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(outputs_.size());
  for (int i = 0, n = outputs_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      outputs_.Get(i));
  }

  // repeated .CoreML.Specification.MILSpec.Operation operations = 3;
  total_size += 1UL * this->_internal_operations_size();
  for (const auto& msg : this->operations_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 4;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_attributes_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
      it = this->_internal_attributes().begin();
      it != this->_internal_attributes().end(); ++it) {
    total_size += Block_AttributesEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}